

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

bool arc::is(atom *a,atom *b)

{
  double dVar1;
  char cVar2;
  __type _Var3;
  variant_alternative_t<7UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pp_Var4;
  variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar5;
  variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar6;
  variant_alternative_t<9UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar7;
  variant_alternative_t<4UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pp_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  variant_alternative_t<10UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *ppa_Var9;
  variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *ppbVar10;
  variant_alternative_t<3UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar11;
  variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  pbVar12;
  
  if (a->type != b->type) {
LAB_00125711:
    return false;
  }
  switch(a->type) {
  case T_NIL:
    return true;
  case T_CONS:
    pvVar5 = (variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
              *)std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&a->val);
    pvVar6 = (variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
              *)std::
                get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&b->val);
    goto LAB_00125708;
  case T_SYM:
    ppbVar10 = std::
               get<2ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&a->val);
    pbVar12 = *ppbVar10;
    ppbVar10 = std::
               get<2ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&b->val);
    break;
  case T_NUM:
    pvVar11 = std::
              get<3ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&a->val);
    dVar1 = *pvVar11;
    pvVar11 = std::
              get<3ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&b->val);
    return (bool)(-(dVar1 == *pvVar11) & 1);
  case T_BUILTIN:
    pp_Var8 = std::
              get<4ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&a->val);
    pbVar12 = (variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
               )*pp_Var8;
    ppbVar10 = (variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
                *)std::
                  get<4ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&b->val);
    break;
  case T_CLOSURE:
  case T_MACRO:
    pvVar5 = std::
             get<5ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       (&a->val);
    pvVar6 = std::
             get<5ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       (&b->val);
    goto LAB_00125708;
  case T_STRING:
    __lhs = atom::asp<std::__cxx11::string>(a);
    __rhs = atom::asp<std::__cxx11::string>(b);
    _Var3 = std::operator==(__lhs,__rhs);
    return _Var3;
  case T_INPUT:
  case T_INPUT_PIPE:
  case T_OUTPUT:
    pp_Var4 = std::
              get<7ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&a->val);
    pbVar12 = (variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
               )*pp_Var4;
    ppbVar10 = (variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
                *)std::
                  get<7ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&b->val);
    break;
  case T_TABLE:
    pvVar5 = (variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
              *)std::
                get<8ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&a->val);
    pvVar6 = (variant_alternative_t<5UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
              *)std::
                get<8ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                          (&b->val);
LAB_00125708:
    return (pvVar5->super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
           (pvVar6->super___shared_ptr<arc::closure,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  case T_CHAR:
    pvVar7 = std::
             get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       (&a->val);
    cVar2 = *pvVar7;
    pvVar7 = std::
             get<9ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                       (&b->val);
    return cVar2 == *pvVar7;
  case T_CONTINUATION:
    ppa_Var9 = std::
               get<10ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (&a->val);
    pbVar12 = (variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
               )*ppa_Var9;
    ppbVar10 = (variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
                *)std::
                  get<10ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                            (&b->val);
    break;
  default:
    goto LAB_00125711;
  }
  return pbVar12 == *ppbVar10;
}

Assistant:

bool is(const atom& a, const atom& b) {
		if (a.type == b.type) {
			switch (a.type) {
			case T_NIL:
				return true;
			case T_CONS:
				return get<shared_ptr<struct cons>>(a.val) == get<shared_ptr<struct cons>>(b.val); // compare pointers
			case T_CLOSURE:
			case T_MACRO:
				return get<shared_ptr<struct closure>>(a.val) == get<shared_ptr<struct closure>>(b.val); // compare pointers
			case T_BUILTIN:
				return get<builtin>(a.val) == get<builtin>(b.val);
			case T_SYM:
				return get<sym>(a.val) == get<sym>(b.val);
			case T_NUM:
				return get<double>(a.val) == get<double>(b.val);
			case T_STRING:
				return a.asp<string>() == b.asp<string>();
			case T_CHAR:
				return get<char>(a.val) == get<char>(b.val);
			case T_TABLE:
				return get<shared_ptr<table>>(a.val) == get<shared_ptr<table>>(b.val); // compare pointers
			case T_INPUT:
			case T_INPUT_PIPE:
			case T_OUTPUT:
				return get<FILE*>(a.val) == get<FILE*>(b.val);
			case T_CONTINUATION:
				return get<jmp_buf*>(a.val) == get<jmp_buf*>(b.val);
			}
		}
		return false;
	}